

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

bool jessilib::equals<char,char16_t>
               (basic_string_view<char,_std::char_traits<char>_> lhs,
               basic_string_view<char16_t,_std::char_traits<char16_t>_> rhs)

{
  char16_t cVar1;
  char16_t *pcVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  char32_t cVar6;
  char *pcVar7;
  jessilib *this;
  decode_result dVar8;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  
  pcVar2 = rhs._M_str;
  pcVar4 = (char *)rhs._M_len;
  pcVar7 = lhs._M_str;
  this = (jessilib *)lhs._M_len;
  pcVar5 = pcVar4;
  while( true ) {
    if ((this == (jessilib *)0x0) || (pcVar5 == (char *)0x0)) {
      return this == (jessilib *)0x0 && pcVar5 == (char *)0x0;
    }
    in_string._M_str = pcVar4;
    in_string._M_len = (size_t)pcVar7;
    dVar8 = decode_codepoint_utf8<char>(this,in_string);
    pcVar4 = (char *)dVar8.units;
    cVar1 = *pcVar2;
    cVar6 = (char32_t)(ushort)cVar1;
    lVar3 = 1;
    if (((pcVar5 != (char *)0x1) && ((cVar1 & 0xfc00U) == 0xd800)) &&
       (((ushort)pcVar2[1] & 0xfc00) == 0xdc00)) {
      cVar6 = (uint)(ushort)cVar1 * 0x400 + (uint)(ushort)pcVar2[1] + L'\xfca02400';
      lVar3 = 2;
    }
    if (dVar8.codepoint != cVar6 || pcVar4 == (char *)0x0) break;
    pcVar7 = pcVar7 + (long)pcVar4;
    this = this + -(long)pcVar4;
    pcVar2 = pcVar2 + lVar3;
    pcVar5 = pcVar5 + -lVar3;
  }
  return false;
}

Assistant:

bool equals(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		return lhs == rhs;
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (lhs_front.codepoint != rhs_front.codepoint) {
			// Codepoints aren't the same
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}